

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

XSerializable * xercesc_4_0::XMLUri::createObject(MemoryManager *manager)

{
  XMLUri *this;
  
  this = (XMLUri *)XMemory::operator_new(0x58,manager);
  XMLUri(this,manager);
  return &this->super_XSerializable;
}

Assistant:

void XMLUri::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {
        serEng<<fPort;
        serEng.writeString(fScheme);
        serEng.writeString(fUserInfo);
        serEng.writeString(fHost);
        serEng.writeString(fRegAuth);
        serEng.writeString(fPath);
        serEng.writeString(fQueryString);
        serEng.writeString(fFragment);
        serEng.writeString(fURIText);
    }
    else
    {
        serEng>>fPort;
        serEng.readString(fScheme);
        serEng.readString(fUserInfo);
        serEng.readString(fHost);
        serEng.readString(fRegAuth);
        serEng.readString(fPath);
        serEng.readString(fQueryString);
        serEng.readString(fFragment);
        serEng.readString(fURIText);
    }

}